

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool __thiscall
dg::vr::RelationsAnalyzer::canShift
          (RelationsAnalyzer *this,ValueRelations *graph,V param,Type shift)

{
  long lVar1;
  pointer ppVVar2;
  Value *pVVar3;
  StructureAnalyzer *this_00;
  V val_00;
  Argument *lt;
  bool bVar4;
  uint uVar5;
  VectorSet<const_llvm::Value_*> *pVVar6;
  _Base_ptr p_Var7;
  Function *func;
  ulong uVar8;
  Value **val;
  pointer ppVVar9;
  V param_local;
  Constant *zero;
  Argument *arg;
  RelationsAnalyzer *local_70;
  ulong local_68;
  undefined1 local_60 [8];
  _Rb_tree_node_base local_58;
  
  lVar1 = *(long *)param;
  param_local = param;
  bVar4 = ValueRelations::hasAnyRelation<llvm::Value_const*>(graph,&param_local);
  if ((bVar4) && (*(char *)(*(long *)param_local + 8) == '\r')) {
    arg = (Argument *)0x0;
    local_70 = this;
    std::bitset<12UL>::set((bitset<12UL> *)&arg,(ulong)shift,true);
    uVar5 = dg::vr::Relations::getNonStrict(shift);
    std::bitset<12UL>::set((bitset<12UL> *)&arg,(ulong)uVar5,true);
    ValueRelations::getRelated<llvm::Value_const*>
              ((RelationsMap *)local_60,graph,&param_local,(Relations *)&arg);
    local_68 = 1L << ((byte)shift & 0x3f);
    for (p_Var7 = local_58._M_left; p_Var7 != &local_58;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      uVar8 = (ulong)p_Var7[1]._M_parent & local_68;
      pVVar6 = ValueRelations::getEqual(graph,*(Handle *)(p_Var7 + 1));
      ppVVar2 = (pVVar6->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppVVar9 = (pVVar6->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVVar9 != ppVVar2;
          ppVVar9 = ppVVar9 + 1) {
        pVVar3 = *ppVVar9;
        if (((char)*(uint *)(*(long *)pVVar3 + 8) == '\r') &&
           (*(uint *)(*(long *)pVVar3 + 8) >> 8 <= *(uint *)(lVar1 + 8) >> 8)) {
          if (uVar8 != 0) {
LAB_001330cd:
            std::
            _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
            ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                         *)local_60);
            return true;
          }
          if (pVVar3[0x10] == (Value)0x10) {
            if (shift == SLT) {
              bVar4 = llvm::APInt::isMaxSignedValue((APInt *)(pVVar3 + 0x18));
            }
            else {
              if (shift != SGT) goto LAB_001330cd;
              bVar4 = llvm::APInt::isMinSignedValue((APInt *)(pVVar3 + 0x18));
            }
            if (bVar4 == false) goto LAB_001330cd;
          }
        }
      }
    }
    std::
    _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                 *)local_60);
    val_00 = param_local;
    if (param_local == (V)0x0) {
      return false;
    }
    if ((byte)param_local[0x10] < 0x1b) {
      return false;
    }
    func = (Function *)llvm::Instruction::getFunction();
    ValueRelations::getEqual((VectorSet<const_llvm::Value_*> *)local_60,graph,val_00);
    for (; local_60 != (undefined1  [8])local_58._0_8_;
        local_60 = (undefined1  [8])((long)local_60 + 8)) {
      arg = *(Argument **)local_60;
      if (arg[0x10] != (Argument)0x14) {
        arg = (Argument *)0x0;
      }
      if ((arg != (Argument *)0x0) && ((*(Type **)arg)[8] == (Type)0xd)) {
        zero = (Constant *)llvm::ConstantInt::get(*(Type **)arg,0,false);
        bVar4 = ValueRelations::are<llvm::Argument_const*,llvm::Constant_const*>
                          (graph,&arg,NE,&zero);
        lt = arg;
        this_00 = *(StructureAnalyzer **)(local_70 + 0x40);
        if (bVar4) {
          shift = dg::vr::Relations::getNonStrict(shift);
        }
        StructureAnalyzer::addPrecondition(this_00,func,lt,shift,(Value *)zero);
        std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
                  ((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                   local_60);
        return true;
      }
    }
    std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
              ((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)local_60);
  }
  return false;
}

Assistant:

bool RelationsAnalyzer::canShift(const ValueRelations &graph, V param,
                                 Relations::Type shift) {
    const auto *paramType = param->getType();
    assert(Relations::isStrict(shift) && Relations::isSigned(shift));
    if (!graph.hasAnyRelation(param) || !param->getType()->isIntegerTy())
        return false;

    // if there is a value lesser/greater with same or smaller range, then param
    // is also inc/decrementable
    for (auto pair : graph.getRelated(
                 param,
                 Relations().set(shift).set(Relations::getNonStrict(shift)))) {
        for (const auto &val : graph.getEqual(pair.first)) {
            const auto *valType = val->getType();
            if (valType->isIntegerTy() &&
                valType->getIntegerBitWidth() <=
                        paramType->getIntegerBitWidth()) {
                if (pair.second.has(shift))
                    return true;
                assert(pair.second.has(Relations::getNonStrict(shift)));
                if (const auto *c = llvm::dyn_cast<llvm::ConstantInt>(val)) {
                    if (!(shift == Relations::SGT && c->isMinValue(true)) &&
                        !(shift == Relations::SLT && c->isMaxValue(true)))
                        return true;
                }
            }
        }
    }

    // if the shifted value is a parameter, it depends on the passed value;
    // check when validating
    if (const auto *paramInst = llvm::dyn_cast<llvm::Instruction>(param)) {
        const llvm::Function *thisFun = paramInst->getFunction();

        for (const auto *val : graph.getEqual(paramInst)) {
            if (const auto *arg = llvm::dyn_cast<llvm::Argument>(val)) {
                if (arg->getType()->isIntegerTy()) {
                    const auto *zero =
                            llvm::ConstantInt::get(arg->getType(), 0);
                    if (graph.are(arg, Relations::NE, zero))
                        structure.addPrecondition(
                                thisFun, arg, Relations::getNonStrict(shift),
                                zero);
                    else
                        structure.addPrecondition(thisFun, arg, shift, zero);
                    return true;
                }
            }
        }
    }
    return false;
}